

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O1

int xmlCurrentChar(xmlParserCtxtPtr ctxt,int *len)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  xmlParserInputPtr pxVar5;
  byte *pbVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  
  if (len == (int *)0x0 || ctxt == (xmlParserCtxtPtr)0x0) {
    return 0;
  }
  pxVar5 = ctxt->input;
  if (pxVar5 == (xmlParserInputPtr)0x0) {
    return 0;
  }
  uVar12 = (long)pxVar5->end - (long)pxVar5->cur;
  if (uVar12 < 0xfa) {
    xmlParserGrow(ctxt);
    uVar12 = (long)ctxt->input->end - (long)ctxt->input->cur;
  }
  pxVar5 = ctxt->input;
  pbVar6 = pxVar5->cur;
  bVar2 = *pbVar6;
  uVar7 = (uint)bVar2;
  uVar11 = (uint)bVar2;
  uVar8 = (uint)bVar2;
  if ((char)bVar2 < '\0') {
    iVar9 = 2;
    if (1 < uVar12) {
      bVar3 = pbVar6[1];
      if ((bVar3 & 0xffffffc0) == 0x80) {
        if (bVar2 < 0xe0) {
          iVar9 = 3;
          if (0xc1 < bVar2) {
            uVar7 = bVar3 & 0x3f | (uVar8 & 0x1f) << 6;
            iVar10 = 2;
            goto LAB_00142c99;
          }
        }
        else if (uVar12 != 2) {
          bVar4 = pbVar6[2];
          if ((bVar4 & 0xffffffc0) != 0x80) goto LAB_00142d90;
          if (bVar2 < 0xf0) {
            uVar11 = (uint)bVar2 << 0xc & 0xffff;
            uVar8 = (bVar3 & 0x3f) << 6 | uVar11;
            iVar9 = 3;
            iVar10 = 3;
            uVar7 = (uint)bVar2 << 0xc;
            if ((0x7ff < uVar8) &&
               ((uVar7 = bVar4 & 0x3f | uVar8, 0xdfff < uVar11 || (uVar8 < 0xd800)))) {
LAB_00142c99:
              *len = iVar10;
              iVar9 = 1;
            }
          }
          else if (3 < uVar12) {
            if ((pbVar6[3] & 0xc0) != 0x80) goto LAB_00142d90;
            uVar7 = (uVar8 & 0xf) * 0x40000;
            uVar8 = (bVar3 & 0x3f) * 0x1000;
            iVar9 = 3;
            if (0xffefffff < (uVar8 + uVar7) - 0x110000) {
              uVar7 = pbVar6[3] & 0x3f | (bVar4 & 0x3f) << 6 | uVar8 | uVar7;
              iVar10 = 4;
              goto LAB_00142c99;
            }
          }
        }
      }
      else {
LAB_00142d90:
        iVar9 = 3;
        uVar7 = (uint)bVar2;
      }
    }
    if (iVar9 != 2) {
      if (iVar9 != 3) {
        return uVar7;
      }
      if ((pxVar5->flags & 0x20) == 0) {
        xmlCtxtErrIO(ctxt,0x51,(char *)0x0);
        piVar1 = &ctxt->input->flags;
        *piVar1 = *piVar1 | 0x20;
      }
      *len = 1;
      return 0x200000;
    }
LAB_00142dc9:
    *len = 0;
LAB_00142dcf:
    uVar11 = 0;
  }
  else {
    if (bVar2 < 0x20) {
      if (uVar8 == 0) {
        if (pxVar5->end <= pbVar6) goto LAB_00142dc9;
        *len = 1;
        xmlFatalErr(ctxt,XML_ERR_INVALID_CHAR,"Char 0x0 out of allowed range\n");
        goto LAB_00142dcf;
      }
      if (uVar8 == 0xd) {
        if (pbVar6[1] == 10) {
          pxVar5->cur = pbVar6 + 1;
        }
        *len = 1;
        return 10;
      }
    }
    *len = 1;
  }
  return uVar11;
}

Assistant:

int
xmlCurrentChar(xmlParserCtxtPtr ctxt, int *len) {
    const unsigned char *cur;
    size_t avail;
    int c;

    if ((ctxt == NULL) || (len == NULL) || (ctxt->input == NULL)) return(0);

    avail = ctxt->input->end - ctxt->input->cur;

    if (avail < INPUT_CHUNK) {
        xmlParserGrow(ctxt);
        avail = ctxt->input->end - ctxt->input->cur;
    }

    cur = ctxt->input->cur;
    c = *cur;

    if (c < 0x80) {
	/* 1-byte code */
        if (c < 0x20) {
            /*
             *   2.11 End-of-Line Handling
             *   the literal two-character sequence "#xD#xA" or a standalone
             *   literal #xD, an XML processor must pass to the application
             *   the single character #xA.
             */
            if (c == '\r') {
                /*
                 * TODO: This function shouldn't change the 'cur' pointer
                 * as side effect, but the NEXTL macro in parser.c relies
                 * on this behavior when incrementing line numbers.
                 */
                if (cur[1] == '\n')
                    ctxt->input->cur++;
                *len = 1;
                c = '\n';
            } else if (c == 0) {
                if (ctxt->input->cur >= ctxt->input->end) {
                    *len = 0;
                } else {
                    *len = 1;
                    /*
                     * TODO: Null bytes should be handled by callers,
                     * but this can be tricky.
                     */
                    xmlFatalErr(ctxt, XML_ERR_INVALID_CHAR,
                            "Char 0x0 out of allowed range\n");
                }
            } else {
                *len = 1;
            }
        } else {
            *len = 1;
        }

        return(c);
    } else {
        int val;

        if (avail < 2)
            goto incomplete_sequence;
        if ((cur[1] & 0xc0) != 0x80)
            goto encoding_error;

        if (c < 0xe0) {
            /* 2-byte code */
            if (c < 0xc2)
                goto encoding_error;
            val = (c & 0x1f) << 6;
            val |= cur[1] & 0x3f;
            *len = 2;
        } else {
            if (avail < 3)
                goto incomplete_sequence;
            if ((cur[2] & 0xc0) != 0x80)
                goto encoding_error;

            if (c < 0xf0) {
                /* 3-byte code */
                val = (c & 0xf) << 12;
                val |= (cur[1] & 0x3f) << 6;
                val |= cur[2] & 0x3f;
                if ((val < 0x800) || ((val >= 0xd800) && (val < 0xe000)))
                    goto encoding_error;
                *len = 3;
            } else {
                if (avail < 4)
                    goto incomplete_sequence;
                if ((cur[3] & 0xc0) != 0x80)
                    goto encoding_error;

                /* 4-byte code */
                val = (c & 0x0f) << 18;
                val |= (cur[1] & 0x3f) << 12;
                val |= (cur[2] & 0x3f) << 6;
                val |= cur[3] & 0x3f;
                if ((val < 0x10000) || (val >= 0x110000))
                    goto encoding_error;
                *len = 4;
            }
        }

        return(val);
    }

encoding_error:
    /* Only report the first error */
    if ((ctxt->input->flags & XML_INPUT_ENCODING_ERROR) == 0) {
        xmlCtxtErrIO(ctxt, XML_ERR_INVALID_ENCODING, NULL);
        ctxt->input->flags |= XML_INPUT_ENCODING_ERROR;
    }
    *len = 1;
    return(XML_INVALID_CHAR);

incomplete_sequence:
    /*
     * An encoding problem may arise from a truncated input buffer
     * splitting a character in the middle. In that case do not raise
     * an error but return 0. This should only happen when push parsing
     * char data.
     */
    *len = 0;
    return(0);
}